

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verstring.c
# Opt level: O0

void ssh_verstring_handle_input(BinaryPacketProtocol *bpp)

{
  LogContext *pLVar1;
  _Bool _Var2;
  int iVar3;
  size_t *s_00;
  IdempotentCallback *pIVar4;
  size_t sVar5;
  void *pvVar6;
  char *pcVar7;
  size_t sVar8;
  toplevel_callback_fn_t p_Var9;
  _func_PktIn_ptr_PacketQueueBase_ptr_PacketQueueNode_ptr__Bool *p_Var10;
  bool bVar11;
  ptrlen pVar12;
  int pv_len;
  char *pv_start;
  void *local_80;
  _Bool success_2;
  char *nl_1;
  ptrlen data_1;
  size_t local_50;
  _Bool success_1;
  char *nl;
  ptrlen data;
  _Bool success;
  int *crLine;
  ssh_verstring_state *s;
  BinaryPacketProtocol *bpp_local;
  
  s_00 = &bpp[-1].in_pq.pqb.end.formal_size;
  iVar3 = (int)*s_00;
  if (iVar3 == 0) {
    if (((ulong)bpp[-1].out_pq.pqb.end.prev & 1) != 0) {
      ssh_verstring_send((ssh_verstring_state *)s_00);
    }
    bpp[-1].remote_bugs = 0;
    goto LAB_00142f74;
  }
  if (iVar3 == 0xfa) goto LAB_00142f7e;
  if (iVar3 == 0x10b) {
    while( true ) {
      sVar5 = bufchain_size(bpp->in_raw);
      if ((sVar5 == 0) && ((bpp->input_eof & 1U) == 0)) break;
      if (sVar5 == 0) goto LAB_001435c6;
      pVar12 = bufchain_prefix(bpp->in_raw);
      data_1.len = (size_t)pVar12.ptr;
      local_50 = pVar12.len;
      pvVar6 = memchr((void *)data_1.len,10,local_50);
      if (pvVar6 == (void *)0x0) {
        bufchain_consume(bpp->in_raw,local_50);
        ssh_check_frozen(bpp->ssh);
      }
      else {
        bufchain_consume(bpp->in_raw,(long)pvVar6 + (1 - data_1.len));
        ssh_check_frozen(bpp->ssh);
LAB_00142f74:
        *(undefined4 *)s_00 = 0xfa;
LAB_00142f7e:
        pIVar4 = (IdempotentCallback *)bufchain_size(bpp->in_raw);
        bVar11 = pIVar4 < bpp[-1].in_pq.pqb.ic;
        if ((bVar11) && ((bpp->input_eof & 1U) == 0)) {
          return;
        }
        if (bVar11) goto LAB_001435c6;
        bufchain_fetch(bpp->in_raw,(void *)((long)&bpp[-1].out_pq.pqb.end.formal_size + 4),
                       (size_t)bpp[-1].in_pq.pqb.ic);
        iVar3 = memcmp((void *)((long)&bpp[-1].out_pq.pqb.end.formal_size + 4),
                       (void *)bpp[-1].in_pq.pqb.total_size,(size_t)bpp[-1].in_pq.pqb.ic);
        if (iVar3 == 0) {
          bufchain_consume(bpp->in_raw,(size_t)bpp[-1].in_pq.pqb.ic);
          ssh_check_frozen(bpp->ssh);
          *(undefined1 *)((long)&bpp[-1].out_pq.pqb.end.prev + 1) = 1;
          BinarySink_put_data((BinarySink *)(*(long *)&bpp[-1].ic_in_raw.queued + 0x18),
                              (void *)bpp[-1].in_pq.pqb.total_size,(size_t)bpp[-1].in_pq.pqb.ic);
          bpp[-1].remote_bugs = 0;
          goto LAB_0014316a;
        }
      }
      *(undefined4 *)s_00 = 0x10b;
    }
  }
  else {
    if (iVar3 == 0x127) {
      while( true ) {
        sVar5 = bufchain_size(bpp->in_raw);
        if ((sVar5 == 0) && ((bpp->input_eof & 1U) == 0)) {
          return;
        }
        if (sVar5 == 0) break;
        pVar12 = bufchain_prefix(bpp->in_raw);
        pv_start = (char *)pVar12.ptr;
        local_80 = (void *)pVar12.len;
        data_1.ptr = local_80;
        pvVar6 = memchr(pv_start,10,(size_t)local_80);
        if (pvVar6 != (void *)0x0) {
          data_1.ptr = (void *)((long)pvVar6 + (1 - (long)pv_start));
        }
        pVar12.len = (size_t)data_1.ptr;
        pVar12.ptr = pv_start;
        BinarySink_put_datapl((BinarySink *)(*(long *)&bpp[-1].ic_in_raw.queued + 0x18),pVar12);
        bufchain_consume(bpp->in_raw,(size_t)data_1.ptr);
        ssh_check_frozen(bpp->ssh);
        if (*(char *)(**(long **)&bpp[-1].ic_in_raw.queued +
                     *(long *)(*(long *)&bpp[-1].ic_in_raw.queued + 0x10) + -1) == '\n') {
          while( true ) {
            bVar11 = false;
            if ((*(long *)(*(long *)&bpp[-1].ic_in_raw.queued + 0x10) != 0) &&
               (bVar11 = true,
               *(char *)(**(long **)&bpp[-1].ic_in_raw.queued +
                        *(long *)(*(long *)&bpp[-1].ic_in_raw.queued + 0x10) + -1) != '\r')) {
              bVar11 = *(char *)(**(long **)&bpp[-1].ic_in_raw.queued +
                                *(long *)(*(long *)&bpp[-1].ic_in_raw.queued + 0x10) + -1) == '\n';
            }
            if (!bVar11) break;
            strbuf_shrink_by(*(strbuf **)&bpp[-1].ic_in_raw.queued,1);
          }
          pLVar1 = bpp->logctx;
          pcVar7 = dupprintf("Remote version: %s",**(undefined8 **)&bpp[-1].ic_in_raw.queued);
          logevent_and_free(pLVar1,pcVar7);
          pcVar7 = (char *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + **(long **)&bpp[-1].ic_in_raw.queued
                           );
          sVar8 = strcspn(pcVar7,"-");
          p_Var9 = (toplevel_callback_fn_t)dupprintf("%.*s",sVar8 & 0xffffffff,pcVar7);
          bpp[-1].ic_out_pq.fn = p_Var9;
          bpp[-1].ic_out_pq.ctx = pcVar7 + (int)sVar8;
          if (*bpp[-1].ic_out_pq.ctx != '\0') {
            if (*bpp[-1].ic_out_pq.ctx != '-') {
              __assert_fail("*s->softwareversion == \'-\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/verstring.c"
                            ,0x14a,"void ssh_verstring_handle_input(BinaryPacketProtocol *)");
            }
            bpp[-1].ic_out_pq.ctx = (void *)((long)bpp[-1].ic_out_pq.ctx + 1);
          }
          ssh_detect_bugs((ssh_verstring_state *)s_00);
          _Var2 = ssh_version_includes_v2((char *)bpp[-1].in_pq.after);
          if ((_Var2) && (_Var2 = ssh_version_includes_v2((char *)bpp[-1].ic_out_pq.fn), _Var2)) {
            *(undefined4 *)((long)&bpp[-1].out_pq.pqb.end.prev + 4) = 2;
          }
          else {
            _Var2 = ssh_version_includes_v1((char *)bpp[-1].in_pq.after);
            if ((!_Var2) || (_Var2 = ssh_version_includes_v1((char *)bpp[-1].ic_out_pq.fn), !_Var2))
            {
              _Var2 = ssh_version_includes_v2((char *)bpp[-1].in_pq.after);
              if (_Var2) {
                ssh_sw_abort(bpp->ssh,
                             "SSH protocol version 2 required by our configuration but remote only provides (old, insecure) SSH-1"
                            );
              }
              else {
                ssh_sw_abort(bpp->ssh,
                             "SSH protocol version 1 required by our configuration but not provided by remote"
                            );
              }
              *(undefined4 *)s_00 = 0;
              return;
            }
            *(undefined4 *)((long)&bpp[-1].out_pq.pqb.end.prev + 4) = 1;
            if ((((ulong)bpp[-1].out_pq.pqb.end.prev & 1) == 0) &&
               (iVar3 = ssh_versioncmp((char *)bpp[-1].in_pq.after,(char *)bpp[-1].ic_out_pq.fn),
               0 < iVar3)) {
              safefree(bpp[-1].in_pq.after);
              p_Var10 = (_func_PktIn_ptr_PacketQueueBase_ptr_PacketQueueNode_ptr__Bool *)
                        dupstr((char *)bpp[-1].ic_out_pq.fn);
              bpp[-1].in_pq.after = p_Var10;
            }
          }
          pLVar1 = bpp->logctx;
          pcVar7 = dupprintf("Using SSH protocol version %d",
                             (ulong)*(uint *)((long)&bpp[-1].out_pq.pqb.end.prev + 4));
          logevent_and_free(pLVar1,pcVar7);
          if (((ulong)bpp[-1].out_pq.pqb.end.prev & 1) == 0) {
            ssh_verstring_send((ssh_verstring_state *)s_00);
          }
          (*(code *)(bpp[-1].out_pq.pqb.end.next)->next)
                    (bpp[-1].out_pq.pqb.end.next,
                     *(undefined4 *)((long)&bpp[-1].out_pq.pqb.end.prev + 4));
          return;
        }
LAB_0014316a:
        *(undefined4 *)s_00 = 0x127;
      }
LAB_001435c6:
      ssh_remote_error(bpp->ssh,"Remote side unexpectedly closed network connection");
      return;
    }
    *(undefined4 *)s_00 = 0;
  }
  return;
}

Assistant:

void ssh_verstring_handle_input(BinaryPacketProtocol *bpp)
{
    struct ssh_verstring_state *s =
        container_of(bpp, struct ssh_verstring_state, bpp);

    crBegin(s->crState);

    /*
     * If we're sending our version string up front before seeing the
     * other side's, then do it now.
     */
    if (s->send_early)
        ssh_verstring_send(s);

    /*
     * Search for a line beginning with the protocol name prefix in
     * the input.
     */
    s->i = 0;
    while (1) {
        /*
         * Every time round this loop, we're at the start of a new
         * line, so look for the prefix.
         */
        BPP_WAITFOR(s->prefix_wanted.len);
        bufchain_fetch(s->bpp.in_raw, s->prefix, s->prefix_wanted.len);
        if (!memcmp(s->prefix, s->prefix_wanted.ptr, s->prefix_wanted.len)) {
            bufchain_consume(s->bpp.in_raw, s->prefix_wanted.len);
            ssh_check_frozen(s->bpp.ssh);
            break;
        }

        /*
         * If we didn't find it, consume data until we see a newline.
         */
        while (1) {
            ptrlen data;
            char *nl;

            /* Wait to receive at least 1 byte, but then consume more
             * than that if it's there. */
            BPP_WAITFOR(1);
            data = bufchain_prefix(s->bpp.in_raw);
            if ((nl = memchr(data.ptr, '\012', data.len)) != NULL) {
                bufchain_consume(s->bpp.in_raw, nl - (char *)data.ptr + 1);
                ssh_check_frozen(s->bpp.ssh);
                break;
            } else {
                bufchain_consume(s->bpp.in_raw, data.len);
                ssh_check_frozen(s->bpp.ssh);
            }
        }
    }

    s->found_prefix = true;

    /*
     * Copy the greeting line so far into vstring.
     */
    put_data(s->vstring, s->prefix_wanted.ptr, s->prefix_wanted.len);

    /*
     * Now read the rest of the greeting line.
     */
    s->i = 0;
    do {
        ptrlen data;
        char *nl;

        BPP_WAITFOR(1);
        data = bufchain_prefix(s->bpp.in_raw);
        if ((nl = memchr(data.ptr, '\012', data.len)) != NULL) {
            data.len = nl - (char *)data.ptr + 1;
        }

        put_datapl(s->vstring, data);
        bufchain_consume(s->bpp.in_raw, data.len);
        ssh_check_frozen(s->bpp.ssh);

    } while (s->vstring->s[s->vstring->len-1] != '\012');

    /*
     * Trim \r and \n from the version string, and replace them with
     * a NUL terminator.
     */
    while (s->vstring->len > 0 &&
           (s->vstring->s[s->vstring->len-1] == '\015' ||
            s->vstring->s[s->vstring->len-1] == '\012'))
        strbuf_shrink_by(s->vstring, 1);

    bpp_logevent("Remote version: %s", s->vstring->s);

    /*
     * Pick out the protocol version and software version. The former
     * goes in a separately allocated string, so that s->vstring
     * remains intact for later use in key exchange; the latter is the
     * tail of s->vstring, so it doesn't need to be allocated.
     */
    {
        const char *pv_start = s->vstring->s + s->prefix_wanted.len;
        int pv_len = strcspn(pv_start, "-");
        s->protoversion = dupprintf("%.*s", pv_len, pv_start);
        s->softwareversion = pv_start + pv_len;
        if (*s->softwareversion) {
            assert(*s->softwareversion == '-');
            s->softwareversion++;
        }
    }

    ssh_detect_bugs(s);

    /*
     * Figure out what actual SSH protocol version we're speaking.
     */
    if (ssh_version_includes_v2(s->our_protoversion) &&
        ssh_version_includes_v2(s->protoversion)) {
        /*
         * We're doing SSH-2.
         */
        s->major_protoversion = 2;
    } else if (ssh_version_includes_v1(s->our_protoversion) &&
               ssh_version_includes_v1(s->protoversion)) {
        /*
         * We're doing SSH-1.
         */
        s->major_protoversion = 1;

        /*
         * There are multiple minor versions of SSH-1, and the
         * protocol does not specify that the minimum of client
         * and server versions is used. So we must adjust our
         * outgoing protocol version to be no higher than that of
         * the other side.
         */
        if (!s->send_early &&
            ssh_versioncmp(s->our_protoversion, s->protoversion) > 0) {
            sfree(s->our_protoversion);
            s->our_protoversion = dupstr(s->protoversion);
        }
    } else {
        /*
         * Unable to agree on a major protocol version at all.
         */
        if (!ssh_version_includes_v2(s->our_protoversion)) {
            ssh_sw_abort(s->bpp.ssh,
                         "SSH protocol version 1 required by our "
                         "configuration but not provided by remote");
        } else {
            ssh_sw_abort(s->bpp.ssh,
                         "SSH protocol version 2 required by our "
                         "configuration but remote only provides "
                         "(old, insecure) SSH-1");
        }
        crStopV;
    }

    bpp_logevent("Using SSH protocol version %d", s->major_protoversion);

    if (!s->send_early) {
        /*
         * If we didn't send our version string early, construct and
         * send it now, because now we know what it is.
         */
        ssh_verstring_send(s);
    }

    /*
     * And we're done. Notify our receiver that we now know our
     * protocol version. This will cause it to disconnect us from the
     * input stream and ultimately free us, because our job is now
     * done.
     */
    s->receiver->got_ssh_version(s->receiver, s->major_protoversion);
    return;

  eof:
    ssh_remote_error(s->bpp.ssh,
                     "Remote side unexpectedly closed network connection");
    return;  /* avoid touching s now it's been freed */

    crFinishV;
}